

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::simplifyLearnt<Minisat::Clause>(Solver *this,Clause *c)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int bLevel;
  Lit *pLVar8;
  Lit *pLVar9;
  long lVar10;
  Solver *in_RSI;
  long in_RDI;
  Solver *in_stack_00000038;
  size_t iteration;
  CRef confl;
  int j;
  int i;
  int preReserve;
  int beforeSize;
  bool reversed;
  bool True_confl;
  Lit *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  Solver *in_stack_ffffffffffffff48;
  Solver *in_stack_ffffffffffffff50;
  CRef in_stack_ffffffffffffff74;
  Solver *in_stack_ffffffffffffff78;
  Solver *in_stack_ffffffffffffff80;
  lbool local_4d;
  int local_4c;
  lbool local_45;
  int local_44;
  int local_40;
  lbool local_39;
  int local_38;
  lbool local_31 [8];
  CRef CVar11;
  int iVar12;
  int i_00;
  ushort in_stack_ffffffffffffffec;
  uint confl_00;
  Solver *this_00;
  
  iVar4 = Clause::size((Clause *)in_RSI);
  *(long *)(in_RDI + 0x6b0) = (long)iVar4 + *(long *)(in_RDI + 0x6b0);
  iVar4 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
  *(int *)(in_RDI + 0x698) = iVar4;
  confl_00 = (uint)in_stack_ffffffffffffffec;
  iVar5 = Clause::size((Clause *)in_RSI);
  iVar4 = 0;
  *(long *)(in_RDI + 0x748) = *(long *)(in_RDI + 0x748) + 1;
  stack0xffffffffffffffd0 = 0;
  do {
    iVar6 = 1;
    if ((*(byte *)(in_RDI + 0x745) & 1) != 0) {
      iVar6 = 2;
    }
    if ((ulong)(long)iVar6 <= stack0xffffffffffffffd0) goto LAB_00142a9b;
    confl_00 = confl_00 & 0xffffff;
    CVar11 = 0xffffffff;
    *(long *)(in_RDI + 0x208) = *(long *)(in_RDI + 0x208) + 1;
    iVar6 = iVar4;
    if (stack0xffffffffffffffd0 != 0) {
      iVar4 = Clause::size((Clause *)in_RSI);
      if (iVar4 == 1) {
LAB_00142a9b:
        if ((confl_00 & 0x10000) != 0) {
          Clause::reverse((Clause *)in_stack_ffffffffffffff50);
        }
        iVar4 = Clause::size((Clause *)in_RSI);
        if (iVar5 == iVar4) {
          lVar10 = *(long *)(in_RDI + 0x750);
        }
        else {
          lVar10 = *(long *)(in_RDI + 0x750) + 1;
        }
        *(long *)(in_RDI + 0x750) = lVar10;
        return;
      }
      Clause::reverse((Clause *)in_stack_ffffffffffffff50);
      confl_00 = (confl_00 ^ 0xff0000) & 0xff01ffff;
      iVar6 = Clause::size((Clause *)in_RSI);
    }
    newDecisionLevel((Solver *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar4 = 0;
    iVar12 = 0;
    while (i_00 = iVar12, iVar7 = Clause::size((Clause *)in_RSI), bLevel = iVar4, iVar12 < iVar7) {
      pLVar8 = Clause::operator[]((Clause *)in_RSI,i_00);
      local_38 = pLVar8->x;
      local_31[0] = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
      lbool::lbool(&local_39,'\x02');
      bVar3 = lbool::operator==(local_31,local_39);
      if (bVar3) {
        pLVar8 = Clause::operator[]((Clause *)in_RSI,i_00);
        local_44 = pLVar8->x;
        local_40 = (int)operator~((Lit)local_44);
        simpleUncheckEnqueue
                  (in_stack_ffffffffffffff78,(Lit)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                   in_stack_ffffffffffffff74);
        pLVar8 = Clause::operator[]((Clause *)in_RSI,i_00);
        bLevel = iVar4 + 1;
        pLVar9 = Clause::operator[]((Clause *)in_RSI,iVar4);
        pLVar9->x = pLVar8->x;
        CVar11 = simplePropagate(in_stack_00000038);
        iVar4 = bLevel;
        if (CVar11 != 0xffffffff) break;
      }
      else {
        pLVar8 = Clause::operator[]((Clause *)in_RSI,i_00);
        local_4c = pLVar8->x;
        local_45 = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
        lbool::lbool(&local_4d,'\0');
        bVar3 = lbool::operator==(&local_45,local_4d);
        if (bVar3) {
          pLVar8 = Clause::operator[]((Clause *)in_RSI,i_00);
          bLevel = iVar4 + 1;
          pLVar9 = Clause::operator[]((Clause *)in_RSI,iVar4);
          pLVar9->x = pLVar8->x;
          confl_00 = CONCAT13(1,(int3)confl_00);
          pLVar8 = Clause::operator[]((Clause *)in_RSI,i_00);
          var((Lit)pLVar8->x);
          CVar11 = reason((Solver *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          break;
        }
      }
      iVar12 = i_00 + 1;
    }
    in_stack_ffffffffffffff80 = in_RSI;
    this_00 = in_stack_ffffffffffffff80;
    iVar4 = Clause::size((Clause *)in_stack_ffffffffffffff80);
    Clause::shrink((Clause *)in_stack_ffffffffffffff80,iVar4 - bLevel);
    if ((CVar11 != 0xffffffff) || (in_RSI = this_00, ((byte)(confl_00 >> 0x18) & 1) == 1)) {
      vec<Minisat::Lit>::clear
                ((vec<Minisat::Lit> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
      vec<unsigned_int>::clear
                ((vec<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
      if (((byte)(confl_00 >> 0x18) & 1) == 1) {
        in_stack_ffffffffffffff78 = (Solver *)(in_RDI + 0x6c8);
        Clause::last((Clause *)this_00);
        vec<Minisat::Lit>::push
                  ((vec<Minisat::Lit> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
      }
      uVar2 = stack0xffffffffffffffd0;
      uVar1 = stack0xffffffffffffffd0 >> 0x38;
      bVar3 = SUB81(uVar1,0);
      unique0x100005e2 = uVar2;
      simpleAnalyze(this_00,confl_00,(vec<Minisat::Lit> *)CONCAT44(iVar6,i_00),
                    (vec<unsigned_int> *)CONCAT44(bLevel,CVar11),bVar3);
      in_stack_ffffffffffffff74 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x6c8));
      iVar4 = Clause::size((Clause *)this_00);
      in_RSI = this_00;
      if ((int)in_stack_ffffffffffffff74 < iVar4) {
        iVar4 = 0;
        while (i_00 = iVar4, iVar12 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x6c8))
              , iVar4 < iVar12) {
          pLVar8 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x6c8),i_00);
          pLVar9 = Clause::operator[]((Clause *)this_00,i_00);
          pLVar9->x = pLVar8->x;
          iVar4 = i_00 + 1;
        }
        in_RSI = this_00;
        iVar4 = Clause::size((Clause *)this_00);
        Clause::shrink((Clause *)this_00,iVar4 - i_00);
      }
    }
    cancelUntil((Solver *)CONCAT44(iVar6,i_00),bLevel,SUB41(CVar11 >> 0x18,0));
    cancelUntilTrailRecord(in_stack_ffffffffffffff50);
    iVar4 = Clause::size((Clause *)in_RSI);
    *(long *)(in_RDI + 0x6a8) = (long)iVar4 + *(long *)(in_RDI + 0x6a8);
    iVar4 = Clause::size((Clause *)in_RSI);
    if ((iVar5 == iVar4) || (iVar4 = Clause::size((Clause *)in_RSI), iVar4 < 2)) goto LAB_00142a9b;
    iVar4 = Clause::size((Clause *)in_RSI);
    *(long *)(in_RDI + 0x758) = (long)(iVar5 - iVar4) + *(long *)(in_RDI + 0x758);
    iVar4 = iVar6;
    if (stack0xffffffffffffffd0 == 0) {
      in_stack_ffffffffffffff50 = *(Solver **)(in_RDI + 0x760);
    }
    else {
      in_stack_ffffffffffffff48 = *(Solver **)(in_RDI + 0x760);
      iVar12 = Clause::size((Clause *)in_RSI);
      in_stack_ffffffffffffff50 =
           (Solver *)((long)&in_stack_ffffffffffffff48->_vptr_Solver + (long)(iVar6 - iVar12));
      in_stack_ffffffffffffff44 = iVar6;
    }
    *(Solver **)(in_RDI + 0x760) = in_stack_ffffffffffffff50;
    register0x00000000 = stack0xffffffffffffffd0 + 1;
  } while( true );
}

Assistant:

inline void Solver::simplifyLearnt(C &c)
{
    ////
    original_length_record += c.size();

    trailRecord = trail.size(); // record the start pointer

    bool True_confl = false, reversed = false;
    int beforeSize = c.size(), preReserve = 0;
    int i, j;
    CRef confl = CRef_Undef;

    LCM_total_tries++;

    TRACE(std::cout << "c start simplifying clause " << c << std::endl);

    // try to simplify in reverse order, in case original succeeds
    for (size_t iteration = 0; iteration < (reverse_LCM ? 2 : 1); ++iteration) {
        True_confl = false;
        confl = CRef_Undef;
        statistics.solveSteps++;
        // reorder the current clause for next iteration?
        // (only useful if size changed in first iteration)
        if (iteration > 0) {
            if (c.size() == 1) break;
            c.reverse();
            reversed = !reversed;
            preReserve = c.size();
        }

        assert(decisionLevel() == 0 && "only run simplification on level 0");
        newDecisionLevel();
        assert(decisionLevel() == 1 && "only run simplification on level 0");

        for (i = 0, j = 0; i < c.size(); i++) {
            if (value(c[i]) == l_Undef) {
                // printf("///@@@ uncheckedEnqueue:index = %d. l_Undef\n", i);
                simpleUncheckEnqueue(~c[i]);
                c[j++] = c[i];
                confl = simplePropagate();
                if (confl != CRef_Undef) {
                    break;
                }
            } else {
                if (value(c[i]) == l_True) {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_True\n", i);
                    c[j++] = c[i];
                    True_confl = true;
                    confl = reason(var(c[i]));
                    break;
                } else {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_False\n", i);
                }
            }
        }
        TRACE(if (c.size() - j > 0) {
            std::cout << "c shrink clause after propagation to " << c << " (dropping last " << c.size() - j
                      << " literals, reverse=" << reversed << ")" << std::endl;
        });
        c.shrink(c.size() - j);

        if (confl != CRef_Undef || True_confl == true) {
            simp_learnt_clause.clear();
            simp_reason_clause.clear();
            if (True_confl == true) {
                simp_learnt_clause.push(c.last());
            }
            simpleAnalyze(confl, simp_learnt_clause, simp_reason_clause, True_confl);

            if (simp_learnt_clause.size() < c.size()) {
                for (i = 0; i < simp_learnt_clause.size(); i++) {
                    c[i] = simp_learnt_clause[i];
                }
                TRACE(if (c.size() - i > 0) {
                    std::cout << "c shrink clause after analysis to " << c << " (dropping last " << c.size() - i
                              << " literals, reverse=" << reversed << ")" << std::endl;
                });
                c.shrink(c.size() - i);
            }
        }

        assert(decisionLevel() == 1);
        cancelUntil(0);
        cancelUntilTrailRecord();
        assert(decisionLevel() == 0);

        ////
        simplified_length_record += c.size();

        // printf("\nbefore : %d, after : %d ", beforeSize, afterSize);
        if (beforeSize == c.size() || c.size() <= 1) break;
        TRACE(std::cout << "c simplified clause to " << c << " (before size: " << beforeSize << ")" << std::endl);
        LCM_dropped_lits += (beforeSize - c.size());
        LCM_dropped_reverse = iteration == 0 ? LCM_dropped_reverse : LCM_dropped_reverse + (preReserve - c.size());
    }

    // make sure the original order is restored, in case we resorted
    if (reversed) c.reverse();

    LCM_successful_tries = beforeSize == c.size() ? LCM_successful_tries : LCM_successful_tries + 1;
}